

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start,bool type)

{
  int iVar1;
  type_conflict5 tVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  Breakpoint *pBVar9;
  undefined7 in_register_00000081;
  int iVar10;
  ulong uVar11;
  Breakpoint *pBVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  Breakpoint pivotkey;
  Breakpoint tmp;
  int local_59c;
  Breakpoint *local_598;
  uint local_58c;
  BreakpointCompare *local_588;
  long local_580;
  long local_578;
  ulong local_570;
  Breakpoint *local_568;
  ulong local_560;
  Breakpoint local_558;
  Breakpoint local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a0;
  Breakpoint local_450;
  Breakpoint local_3f8;
  Breakpoint local_3a0;
  Breakpoint local_348;
  Breakpoint local_2f0;
  Breakpoint local_298;
  Breakpoint local_240;
  Breakpoint local_1e8;
  Breakpoint local_190;
  Breakpoint local_138;
  Breakpoint local_e0;
  Breakpoint local_88;
  
  uVar7 = CONCAT44(in_register_0000000c,start);
  local_58c = (uint)CONCAT71(in_register_00000081,type);
  if (end <= start + 1) {
    return;
  }
  uVar11 = (ulong)(end - 1);
  local_598 = keys;
  local_588 = compare;
LAB_00387d07:
  iVar4 = (int)uVar11;
  iVar5 = (int)uVar7;
  uVar3 = iVar4 - iVar5;
  if ((int)uVar3 < 0x19) {
    if ((int)uVar3 < 1) {
      return;
    }
    SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
              (keys,iVar4,local_588,iVar5);
    return;
  }
  local_558.val.m_backend.fpclass = cpp_dec_float_finite;
  local_558.val.m_backend.prec_elem = 0x10;
  local_558.val.m_backend.data._M_elems[0] = 0;
  local_558.val.m_backend.data._M_elems[1] = 0;
  local_558.val.m_backend.data._M_elems[2] = 0;
  local_558.val.m_backend.data._M_elems[3] = 0;
  local_558.val.m_backend.data._M_elems[4] = 0;
  local_558.val.m_backend.data._M_elems[5] = 0;
  local_558.val.m_backend.data._M_elems[6] = 0;
  local_558.val.m_backend.data._M_elems[7] = 0;
  local_558.val.m_backend.data._M_elems[8] = 0;
  local_558.val.m_backend.data._M_elems[9] = 0;
  local_558.val.m_backend.data._M_elems[10] = 0;
  local_558.val.m_backend.data._M_elems[0xb] = 0;
  local_558.val.m_backend.data._M_elems[0xc] = 0;
  local_558.val.m_backend.data._M_elems[0xd] = 0;
  local_558.val.m_backend.data._M_elems._56_5_ = 0;
  local_558.val.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_558.val.m_backend.exp = 0;
  local_558.val.m_backend.neg = false;
  local_4f8.val.m_backend.fpclass = cpp_dec_float_finite;
  local_4f8.val.m_backend.prec_elem = 0x10;
  local_4f8.val.m_backend.data._M_elems[0] = 0;
  local_4f8.val.m_backend.data._M_elems[1] = 0;
  local_4f8.val.m_backend.data._M_elems[2] = 0;
  local_4f8.val.m_backend.data._M_elems[3] = 0;
  local_4f8.val.m_backend.data._M_elems[4] = 0;
  local_4f8.val.m_backend.data._M_elems[5] = 0;
  local_4f8.val.m_backend.data._M_elems[6] = 0;
  local_4f8.val.m_backend.data._M_elems[7] = 0;
  local_4f8.val.m_backend.data._M_elems[8] = 0;
  local_4f8.val.m_backend.data._M_elems[9] = 0;
  local_4f8.val.m_backend.data._M_elems[10] = 0;
  local_4f8.val.m_backend.data._M_elems[0xb] = 0;
  local_4f8.val.m_backend.data._M_elems[0xc] = 0;
  local_4f8.val.m_backend.data._M_elems[0xd] = 0;
  local_4f8.val.m_backend.data._M_elems._56_5_ = 0;
  local_4f8.val.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_4f8.val.m_backend.exp = 0;
  local_4f8.val.m_backend.neg = false;
  local_568 = keys + (int)((uVar3 >> 1) + iVar5);
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Breakpoint::operator=(&local_558,local_568);
  local_578 = (long)iVar4;
  local_580 = (long)iVar5;
  uVar13 = uVar7 & 0xffffffff;
  uVar8 = uVar11 & 0xffffffff;
  local_570 = uVar11;
  local_560 = uVar7;
  do {
    uVar7 = (ulong)(int)uVar13;
    if ((local_58c & 1) == 0) {
      uVar13 = (ulong)(int)uVar8;
      pBVar9 = local_598 + uVar7;
      for (; (long)uVar7 < local_578; uVar7 = uVar7 + 1) {
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::Breakpoint(&local_1e8,pBVar9);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::Breakpoint(&local_240,&local_558);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()(&local_4a0,local_588,&local_1e8,&local_240);
        local_59c = 0;
        tVar2 = boost::multiprecision::operator<=(&local_4a0,&local_59c);
        if (!tVar2) break;
        pBVar9 = pBVar9 + 1;
      }
      pBVar9 = local_598 + uVar13;
      for (; local_580 < (long)uVar13; uVar13 = uVar13 - 1) {
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::Breakpoint(&local_298,pBVar9);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::Breakpoint(&local_2f0,&local_558);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()(&local_4a0,local_588,&local_298,&local_2f0);
        local_59c = 0;
        tVar2 = boost::multiprecision::operator>(&local_4a0,&local_59c);
        if (!tVar2) break;
        pBVar9 = pBVar9 + -1;
      }
    }
    else {
      pBVar9 = local_598 + uVar7;
      for (; (long)uVar7 < local_578; uVar7 = uVar7 + 1) {
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::Breakpoint(&local_88,pBVar9);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::Breakpoint(&local_e0,&local_558);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()(&local_4a0,local_588,&local_88,&local_e0);
        local_59c = 0;
        tVar2 = boost::multiprecision::operator<(&local_4a0,&local_59c);
        if (!tVar2) break;
        pBVar9 = pBVar9 + 1;
      }
      uVar13 = (ulong)(int)uVar8;
      pBVar9 = local_598 + uVar13;
      for (; local_580 < (long)uVar13; uVar13 = uVar13 - 1) {
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::Breakpoint(&local_138,pBVar9);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::Breakpoint(&local_190,&local_558);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()(&local_4a0,local_588,&local_138,&local_190);
        local_59c = 0;
        tVar2 = boost::multiprecision::operator>=(&local_4a0,&local_59c);
        if (!tVar2) break;
        pBVar9 = pBVar9 + -1;
      }
    }
    pBVar9 = local_598;
    iVar5 = (int)uVar7;
    iVar4 = (int)uVar13;
    if (iVar4 <= iVar5) break;
    pBVar12 = local_598 + iVar5;
    SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::Breakpoint::operator=(&local_4f8,pBVar12);
    SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::Breakpoint::operator=(pBVar12,pBVar9 + iVar4);
    SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::Breakpoint::operator=(pBVar9 + iVar4,&local_4f8);
    uVar13 = (ulong)(iVar5 + 1);
    uVar8 = (ulong)(iVar4 - 1);
  } while( true );
  if ((local_58c & 1) == 0) {
    uVar13 = (ulong)iVar4;
    pBVar9 = local_598 + uVar13;
    for (; local_580 < (long)uVar13; uVar13 = uVar13 - 1) {
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::Breakpoint(&local_3f8,&local_558);
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::Breakpoint(&local_450,pBVar9);
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::BreakpointCompare::operator()(&local_4a0,local_588,&local_3f8,&local_450);
      local_59c = 0;
      tVar2 = boost::multiprecision::operator<=(&local_4a0,&local_59c);
      if (!tVar2) break;
      pBVar9 = pBVar9 + -1;
    }
    uVar11 = local_570;
    iVar5 = (int)local_570;
    if (iVar5 == (int)uVar13) {
      pBVar12 = local_598 + local_578;
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::operator=(&local_4f8,pBVar12);
      pBVar9 = local_568;
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::operator=(pBVar12,local_568);
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::operator=(pBVar9,&local_4f8);
      uVar13 = (ulong)(iVar5 - 1);
    }
  }
  else {
    uVar7 = (ulong)iVar5;
    pBVar9 = local_598 + uVar7;
    for (; (long)uVar7 < local_578; uVar7 = uVar7 + 1) {
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::Breakpoint(&local_348,&local_558);
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::Breakpoint(&local_3a0,pBVar9);
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::BreakpointCompare::operator()(&local_4a0,local_588,&local_348,&local_3a0);
      local_59c = 0;
      tVar2 = boost::multiprecision::operator>=(&local_4a0,&local_59c);
      if (!tVar2) break;
      pBVar9 = pBVar9 + 1;
    }
    iVar5 = (int)local_560;
    uVar11 = local_570;
    if (iVar5 == (int)uVar7) {
      pBVar12 = local_598 + local_580;
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::operator=(&local_4f8,pBVar12);
      pBVar9 = local_568;
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::operator=(pBVar12,local_568);
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::operator=(pBVar9,&local_4f8);
      uVar7 = (ulong)(iVar5 + 1);
      uVar11 = local_570;
    }
  }
  keys = local_598;
  iVar5 = (int)uVar13;
  iVar4 = (int)local_560;
  iVar10 = (int)uVar11;
  iVar6 = (int)uVar7;
  if (iVar10 - iVar6 < iVar5 - iVar4) {
    bVar15 = SBORROW4(iVar10,iVar6);
    iVar1 = iVar10 - iVar6;
    bVar14 = iVar10 == iVar6;
    uVar7 = local_560 & 0xffffffff;
    uVar11 = uVar13 & 0xffffffff;
    iVar5 = iVar10;
    iVar4 = iVar6;
  }
  else {
    bVar15 = SBORROW4(iVar5,iVar4);
    iVar1 = iVar5 - iVar4;
    bVar14 = iVar5 == iVar4;
  }
  if (!bVar14 && bVar15 == iVar1 < 0) {
    SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
              (local_598,iVar5 + 1,local_588,iVar4,(bool)(~(byte)local_58c & 1));
  }
  local_58c = local_58c ^ 1;
  goto LAB_00387d07;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}